

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interfaceOperations.cpp
# Opt level: O1

string * gmlc::networking::getLocalExternalAddressV4(string *__return_storage_ptr__,string *server)

{
  undefined8 *puVar1;
  size_type sVar2;
  string *psVar3;
  undefined8 this;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  long lVar5;
  int family;
  _Alloc_hider _Var6;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  ulong uVar8;
  undefined1 *puVar9;
  ulong uVar10;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var11;
  undefined8 uVar12;
  undefined1 *puVar13;
  bool bVar14;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> ndef;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  candidate_addresses;
  string sstring;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  resolved_addresses;
  error_code ec;
  shared_ptr<gmlc::networking::AsioContextManager> srv;
  query query;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  interface_addresses;
  query query_server;
  resolver resolver;
  string local_288;
  string *local_268;
  undefined1 local_260 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_250;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_240;
  string local_238;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_218;
  size_type sStack_210;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_208;
  error_code local_1e8;
  undefined1 local_1d8 [16];
  undefined1 local_1c8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aaStack_1b8 [2];
  _Head_base<0UL,_asio::io_context_*,_false> local_198;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_188 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_168;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_150;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_138;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_120;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_108;
  pointer pcStack_100;
  undefined1 local_f0 [48];
  _Alloc_hider local_c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b0;
  _Alloc_hider local_a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_90;
  io_object_impl<asio::detail::resolver_service<asio::ip::tcp>,_asio::any_io_executor> local_80;
  
  local_f0._8_8_ = 0;
  local_f0[0x10] = '\0';
  local_f0._0_8_ = local_f0 + 0x10;
  AsioContextManager::getContextPointer((AsioContextManager *)local_1d8,(string *)local_f0);
  if ((undefined1 *)local_f0._0_8_ != local_f0 + 0x10) {
    operator_delete((void *)local_f0._0_8_,CONCAT71(local_f0._17_7_,local_f0[0x10]) + 1);
  }
  ::asio::detail::
  io_object_impl<asio::detail::resolver_service<asio::ip::tcp>,_asio::any_io_executor>::
  io_object_impl<asio::io_context>(&local_80,0,0,*(io_context **)(local_1d8._0_8_ + 0x40));
  local_238._M_dataplus._M_p._0_4_ = 2;
  local_1c8._0_8_ = aaStack_1b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1c8,"");
  ::asio::ip::basic_resolver_query<asio::ip::tcp>::basic_resolver_query
            ((basic_resolver_query<asio::ip::tcp> *)local_f0,(protocol_type *)&local_238,server,
             (string *)local_1c8,address_configured);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._0_8_ != aaStack_1b8) {
    operator_delete((void *)local_1c8._0_8_,(ulong)(aaStack_1b8[0]._M_allocated_capacity + 1));
  }
  local_1e8._M_value = 0;
  local_1e8._M_cat = (error_category *)std::_V2::system_category();
  ::asio::detail::resolver_service<asio::ip::tcp>::resolve
            ((results_type *)local_1c8,local_80.service_,&local_80.implementation_,
             (query_type *)local_f0,&local_1e8);
  this = local_1c8._8_8_;
  if (local_1e8._M_value == 0) {
    sVar2 = *(size_type *)local_1c8._0_8_;
    lVar5 = aaStack_1b8[0]._M_allocated_capacity * 0x60;
    puVar1 = (undefined8 *)(sVar2 + 8 + lVar5);
    local_108 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)*puVar1;
    pcStack_100 = (pointer)puVar1[1];
    if (*(short *)(sVar2 + lVar5) == 2) {
      aaStack_1b8[0]._8_4_ = 0;
      local_1c8._0_8_ = (ulong)*(uint *)(sVar2 + 4 + lVar5) << 0x20;
      local_1c8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      aaStack_1b8[0]._M_allocated_capacity = (pointer)0x0;
    }
    else {
      aaStack_1b8[0]._8_4_ = *(undefined4 *)(sVar2 + 0x18 + lVar5);
      local_1c8._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)0x1;
      local_1c8._8_8_ = local_108;
      aaStack_1b8[0]._0_8_ = pcStack_100;
    }
    ::asio::ip::address::to_string_abi_cxx11_(&local_238,(address *)local_1c8);
    netif::getInterfaceAddresses_abi_cxx11_(&local_120,(netif *)0x2,family);
    local_208.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_208.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_208.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_218 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)CONCAT44(local_218._4_4_,2);
    ::asio::ip::host_name_abi_cxx11_();
    local_260._0_8_ = &aStack_250;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_260,"");
    ::asio::ip::basic_resolver_query<asio::ip::tcp>::basic_resolver_query
              ((basic_resolver_query<asio::ip::tcp> *)local_1c8,(protocol_type *)&local_218,
               &local_288,(string *)local_260,address_configured);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_260._0_8_ != &aStack_250) {
      operator_delete((void *)local_260._0_8_,aStack_250._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_288._M_dataplus._M_p != &local_288.field_2) {
      operator_delete(local_288._M_dataplus._M_p,local_288.field_2._M_allocated_capacity + 1);
    }
    ::asio::detail::resolver_service<asio::ip::tcp>::resolve
              ((results_type *)&local_288,local_80.service_,&local_80.implementation_,
               (query_type *)local_1c8,&local_1e8);
    p_Var11 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_288._M_string_length;
    if (local_1e8._M_value == 0) {
      local_268 = __return_storage_ptr__;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_288._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        _Var6._M_p = local_288._M_dataplus._M_p;
        uVar12 = local_288.field_2._M_allocated_capacity;
        do {
          sVar2 = *(size_type *)_Var6._M_p;
          lVar5 = uVar12 * 0x60;
          puVar1 = (undefined8 *)(sVar2 + 8 + lVar5);
          local_218 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)*puVar1;
          sStack_210 = puVar1[1];
          if (*(short *)(sVar2 + lVar5) == 2) {
            local_260._0_8_ = (ulong)*(uint *)(sVar2 + 4 + lVar5) << 0x20;
            aStack_250._8_4_ = 0;
            local_260._8_8_ =
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)0x0;
            aStack_250._M_allocated_capacity = 0;
          }
          else {
            aStack_250._8_4_ = *(undefined4 *)(sVar2 + 0x18 + lVar5);
            local_260._0_8_ =
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)0x1;
            local_260._8_8_ = local_218;
            aStack_250._M_allocated_capacity = sStack_210;
          }
          ::asio::ip::address::to_string_abi_cxx11_(&local_288,(address *)local_260);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_208
                     ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      &local_288);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_288._M_dataplus._M_p != &local_288.field_2) {
            operator_delete(local_288._M_dataplus._M_p,local_288.field_2._M_allocated_capacity + 1);
          }
          uVar12 = uVar12 + 1;
          p_Var4 = p_Var11;
          if (uVar12 == ((long)(*(size_type *)((long)_Var6._M_p + 8) - *(size_type *)_Var6._M_p) >>
                        5) * -0x5555555555555555) {
            _Var6._M_p = (pointer)0x0;
            uVar12 = 0;
            p_Var4 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            if (p_Var11 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var11);
              _Var6._M_p = (pointer)0x0;
              uVar12 = 0;
              p_Var4 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            }
          }
          p_Var11 = p_Var4;
        } while ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)_Var6._M_p !=
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)0x0);
      }
      CLI::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_138,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_120);
      CLI::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_150,&local_208);
      psVar3 = local_268;
      prioritizeExternalAddresses
                ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_260,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&local_138,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&local_150);
      CLI::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_150);
      CLI::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_138);
      local_240 = &psVar3->field_2;
      (psVar3->_M_dataplus)._M_p = (pointer)local_240;
      std::__cxx11::string::_M_construct<char*>
                ((string *)psVar3,*(size_type *)local_260._0_8_,
                 *(long *)(local_260._0_8_ + 8) + *(size_type *)local_260._0_8_);
      uVar12 = local_260._8_8_;
      uVar10 = 0;
      if (psVar3->_M_string_length != 0 && local_238._M_string_length != 0) {
        uVar8 = 0;
        while (*(char *)(CONCAT44(local_238._M_dataplus._M_p._4_4_,local_238._M_dataplus._M_p._0_4_)
                        + uVar8) == (psVar3->_M_dataplus)._M_p[uVar8]) {
          uVar10 = uVar8 + 1;
          if ((local_238._M_string_length - 1 == uVar8) ||
             (bVar14 = psVar3->_M_string_length - 1 == uVar8, uVar8 = uVar10, bVar14))
          goto LAB_0041ec61;
        }
        uVar10 = uVar8 & 0xffffffff;
      }
LAB_0041ec61:
      if (local_260._0_8_ != local_260._8_8_) {
        paVar7 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)local_260._0_8_;
        do {
          local_288._M_dataplus._M_p = (pointer)&local_288.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_288,paVar7->_M_allocated_capacity,
                     (&paVar7->_M_allocated_capacity)[1] + paVar7->_M_allocated_capacity);
          puVar13 = (undefined1 *)0x0;
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_288._M_string_length !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0 && local_238._M_string_length != 0
             ) {
            puVar9 = (undefined1 *)0x0;
            while (puVar9[CONCAT44(local_238._M_dataplus._M_p._4_4_,local_238._M_dataplus._M_p._0_4_
                                  )] == local_288._M_dataplus._M_p[(long)puVar9]) {
              puVar13 = puVar9 + 1;
              if (((undefined1 *)(local_238._M_string_length - 1) == puVar9) ||
                 (bVar14 = (undefined1 *)
                           ((long)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                   (local_288._M_string_length + -0x10))->_M_weak_count + 3U) ==
                           puVar9, puVar9 = puVar13, bVar14)) goto LAB_0041ece7;
            }
            puVar13 = (undefined1 *)((ulong)puVar9 & 0xffffffff);
          }
LAB_0041ece7:
          if (6 < (int)puVar13 && (int)uVar10 < (int)puVar13) {
            CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            _M_assign((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_268
                      ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_288);
            uVar10 = (ulong)puVar13 & 0xffffffff;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_288._M_dataplus._M_p != &local_288.field_2) {
            operator_delete(local_288._M_dataplus._M_p,local_288.field_2._M_allocated_capacity + 1);
          }
          paVar7 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)(&paVar7->_M_allocated_capacity + 4);
        } while (paVar7 != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                            *)uVar12);
      }
      CLI::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_260);
      __return_storage_ptr__ = local_268;
    }
    else {
      getLocalExternalAddressV4_abi_cxx11_();
    }
    if (p_Var11 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var11);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_188[1]._0_8_ != &local_168) {
      operator_delete((void *)local_188[1]._0_8_,(ulong)(local_168._M_allocated_capacity + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_198._M_head_impl != local_188) {
      operator_delete(local_198._M_head_impl,local_188[0]._M_allocated_capacity + 1);
    }
    CLI::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_208);
    CLI::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_120);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_238._M_dataplus._M_p._4_4_,local_238._M_dataplus._M_p._0_4_) !=
        &local_238.field_2) {
      operator_delete((undefined1 *)
                      CONCAT44(local_238._M_dataplus._M_p._4_4_,local_238._M_dataplus._M_p._0_4_),
                      local_238.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    getLocalExternalAddressV4_abi_cxx11_();
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_p != &local_90) {
    operator_delete(local_a0._M_p,local_90._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_p != &local_b0) {
    operator_delete(local_c0._M_p,local_b0._M_allocated_capacity + 1);
  }
  ::asio::detail::
  io_object_impl<asio::detail::resolver_service<asio::ip::tcp>,_asio::any_io_executor>::
  ~io_object_impl(&local_80);
  if ((element_type *)local_1d8._8_8_ != (element_type *)0x0) {
    CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1d8._8_8_);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string getLocalExternalAddressV4(const std::string& server)
{
#ifndef GMLC_NETWORKING_DISABLE_ASIO
    auto srv = gmlc::networking::AsioContextManager::getContextPointer();

    asio::ip::tcp::resolver resolver(srv->getBaseContext());

    asio::ip::tcp::resolver::query query_server(
        asio::ip::tcp::v4(), server, "");
    std::error_code ec;
    asio::ip::tcp::resolver::iterator it_server =
        resolver.resolve(query_server, ec);
    if (ec) {
        return getLocalExternalAddressV4();
    }
    asio::ip::tcp::endpoint servep = *it_server;

    asio::ip::tcp::resolver::iterator end;

    auto sstring = (it_server == end) ? server : servep.address().to_string();
#else
    std::string sstring = server;
#endif

    auto interface_addresses = gmlc::netif::getInterfaceAddressesV4();

    std::vector<std::string> resolved_addresses;
#ifndef GMLC_NETWORKING_DISABLE_ASIO
    asio::ip::tcp::resolver::query query(
        asio::ip::tcp::v4(), asio::ip::host_name(), "");
    asio::ip::tcp::resolver::iterator it = resolver.resolve(query, ec);
    if (ec) {
        return getLocalExternalAddressV4();
    }
    // asio::ip::tcp::endpoint endpoint = *it;

    while (it != end) {
        asio::ip::tcp::endpoint ept = *it;
        resolved_addresses.push_back(ept.address().to_string());
        ++it;
    }
#endif
    auto candidate_addresses =
        prioritizeExternalAddresses(interface_addresses, resolved_addresses);

    int cnt = 0;
    std::string def = candidate_addresses[0];
    cnt = matchcount(sstring.begin(), sstring.end(), def.begin(), def.end());
    for (auto ndef : candidate_addresses) {
        auto mcnt = matchcount(
            sstring.begin(), sstring.end(), ndef.begin(), ndef.end());
        if ((mcnt > cnt) && (mcnt >= 7)) {
            def = ndef;
            cnt = mcnt;
        }
    }
    return def;
}